

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

void satoko_default_opts(satoko_opts_t *opts)

{
  opts->var_act_limit = 0;
  opts->clause_max_sz_bin_resol = 0;
  opts->clause_min_lbd_bin_resol = 0;
  opts->var_decay = 0.0;
  opts->clause_decay = 0.0;
  opts->var_act_rescale = 0;
  opts->conf_limit = 0;
  opts->prop_limit = 0;
  opts->garbage_max_ratio = 0.0;
  opts->verbose = '\0';
  opts->no_simplify = '\0';
  *(undefined2 *)&opts->field_0x66 = 0;
  opts->f_rst = 0.8;
  opts->b_rst = 1.4;
  opts->fst_block_rst = 10000;
  opts->sz_lbd_bqueue = 0x32;
  opts->sz_trail_bqueue = 5000;
  opts->n_conf_fst_reduce = 2000;
  opts->inc_reduce = 300;
  opts->inc_special_reduce = 1000;
  opts->lbd_freeze_clause = 0x1e;
  opts->learnt_ratio = 0.5;
  opts->var_act_limit = 0x14c924d692ca61b;
  opts->var_act_rescale = 200;
  opts->var_decay = 0.95;
  opts->clause_max_sz_bin_resol = 0x1e;
  opts->clause_min_lbd_bin_resol = 6;
  opts->garbage_max_ratio = 0.3;
  return;
}

Assistant:

void satoko_default_opts(satoko_opts_t *opts)
{
    memset(opts, 0, sizeof(satoko_opts_t));
    opts->verbose = 0;
    opts->no_simplify = 0;
    /* Limits */
    opts->conf_limit = 0;
    opts->prop_limit  = 0;
    /* Constants used for restart heuristic */
    opts->f_rst = 0.8;
    opts->b_rst = 1.4;
    opts->fst_block_rst   = 10000;
    opts->sz_lbd_bqueue   = 50;
    opts->sz_trail_bqueue = 5000;
    /* Constants used for clause database reduction heuristic */
    opts->n_conf_fst_reduce = 2000;
    opts->inc_reduce = 300;
    opts->inc_special_reduce = 1000;
    opts->lbd_freeze_clause = 30;
    opts->learnt_ratio = 0.5;
    /* VSIDS heuristic */
    opts->var_act_limit = VAR_ACT_LIMIT;
    opts->var_act_rescale = VAR_ACT_RESCALE;
    opts->var_decay = 0.95;
    opts->clause_decay = (clause_act_t) 0.995;
    /* Binary resolution */
    opts->clause_max_sz_bin_resol = 30;
    opts->clause_min_lbd_bin_resol = 6;

    opts->garbage_max_ratio = (float) 0.3;
}